

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_calculateEdgeDifferentials
               (JNIEnv *env,jobject obj,jint instance,jintArray postBufferIndices,
               jintArray preBufferIndices,jintArray derivativeMatrixIndices,
               jintArray categoryWeightsIndices,jint count,jdoubleArray outDerivatives,
               jdoubleArray outSumDerivatives,jdoubleArray outSumSquaredDerivatives)

{
  jint jVar1;
  jdouble *pjVar2;
  jint *pjVar3;
  jint *pjVar4;
  jint *pjVar5;
  jint *pjVar6;
  undefined4 in_EDX;
  undefined4 in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  jint errCode;
  jint *jCategoryWeightsIndices;
  jint *jDerivativeMatrixIndices;
  jint *jPreBufferIndices;
  jint *jPostBufferIndices;
  jdouble *jOutSumSquaredDerivatives;
  jdouble *jOutSumDerivatives;
  jdouble *jOutDerivatives;
  jintArray in_stack_ffffffffffffff58;
  JNIEnv_ *in_stack_ffffffffffffff60;
  JNIEnv_ *in_stack_ffffffffffffff70;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 uStack_74;
  
  if (in_stack_00000018 == 0) {
    uStack_74 = 0;
  }
  else {
    pjVar2 = JNIEnv_::GetDoubleArrayElements
                       (in_stack_ffffffffffffff60,(jdoubleArray)in_stack_ffffffffffffff58,
                        (jboolean *)0x104797);
    uStack_74 = (jint)((ulong)pjVar2 >> 0x20);
  }
  if (in_stack_00000020 == 0) {
    local_80 = (jdouble *)0x0;
  }
  else {
    local_80 = JNIEnv_::GetDoubleArrayElements
                         (in_stack_ffffffffffffff60,(jdoubleArray)in_stack_ffffffffffffff58,
                          (jboolean *)0x1047d3);
  }
  if (in_stack_00000028 == 0) {
    local_88 = (jintArray)0x0;
  }
  else {
    local_88 = (jintArray)
               JNIEnv_::GetDoubleArrayElements
                         (in_stack_ffffffffffffff60,(jdoubleArray)in_stack_ffffffffffffff58,
                          (jboolean *)0x10480f);
  }
  pjVar3 = JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(jboolean *)0x104837);
  pjVar4 = JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(jboolean *)0x104855);
  pjVar5 = JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(jboolean *)0x104870);
  pjVar6 = JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(jboolean *)0x10488e);
  jVar1 = beagleCalculateEdgeDerivatives(in_EDX,pjVar3,pjVar4,pjVar5,pjVar6,in_stack_00000010);
  JNIEnv_::ReleaseIntArrayElements(in_stack_ffffffffffffff70,local_88,(jint *)local_80,uStack_74);
  JNIEnv_::ReleaseIntArrayElements(in_stack_ffffffffffffff70,local_88,(jint *)local_80,uStack_74);
  JNIEnv_::ReleaseIntArrayElements(in_stack_ffffffffffffff70,local_88,(jint *)local_80,uStack_74);
  JNIEnv_::ReleaseIntArrayElements(in_stack_ffffffffffffff70,local_88,(jint *)local_80,uStack_74);
  if (in_stack_00000018 != 0) {
    JNIEnv_::ReleaseDoubleArrayElements
              (in_stack_ffffffffffffff70,(jdoubleArray)local_88,local_80,uStack_74);
  }
  if (in_stack_00000020 != 0) {
    JNIEnv_::ReleaseDoubleArrayElements
              (in_stack_ffffffffffffff70,(jdoubleArray)local_88,local_80,uStack_74);
  }
  if (in_stack_00000028 != 0) {
    JNIEnv_::ReleaseDoubleArrayElements
              (in_stack_ffffffffffffff70,(jdoubleArray)local_88,local_80,uStack_74);
  }
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_calculateEdgeDifferentials
        (JNIEnv *env, jobject obj, jint instance,
                jintArray postBufferIndices,
                jintArray preBufferIndices,
                jintArray derivativeMatrixIndices,
                jintArray categoryWeightsIndices,
                jint count,
                jdoubleArray outDerivatives,
                jdoubleArray outSumDerivatives,
                jdoubleArray outSumSquaredDerivatives) {

    jdouble *jOutDerivatives = outDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outDerivatives, NULL);

    jdouble* jOutSumDerivatives = outSumDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outSumDerivatives, NULL);

    jdouble* jOutSumSquaredDerivatives = outSumSquaredDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outSumSquaredDerivatives, NULL);

    jint *jPostBufferIndices = env->GetIntArrayElements(postBufferIndices, NULL);
    jint *jPreBufferIndices  = env->GetIntArrayElements(preBufferIndices, NULL);

    jint *jDerivativeMatrixIndices = env->GetIntArrayElements(derivativeMatrixIndices, NULL);
    jint *jCategoryWeightsIndices = env->GetIntArrayElements(categoryWeightsIndices, NULL);

    jint errCode = beagleCalculateEdgeDerivatives(instance, (int*)jPostBufferIndices, (int*)jPreBufferIndices,
                                                 (int*)jDerivativeMatrixIndices, (int*)jCategoryWeightsIndices, count,
                                                 jOutDerivatives, jOutSumDerivatives, jOutSumSquaredDerivatives);

    env->ReleaseIntArrayElements(postBufferIndices, jPostBufferIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(preBufferIndices, jPreBufferIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(derivativeMatrixIndices, jDerivativeMatrixIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(categoryWeightsIndices, jCategoryWeightsIndices, JNI_ABORT);

    if (outDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outDerivatives, jOutDerivatives, 0);
    }

    if (outSumDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outSumDerivatives, jOutSumDerivatives, 0);
    }

    if (outSumSquaredDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outSumSquaredDerivatives, jOutSumSquaredDerivatives, 0);
    }

    return errCode;
}